

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

int64_t npas4::GetRAMVirtualUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int64_t iVar3;
  char line [128];
  undefined4 local_a8;
  undefined3 uStack_a4;
  
  __stream = fopen("/proc/self/status","r");
  iVar3 = 0;
  do {
    pcVar2 = fgets((char *)&local_a8,0x80,__stream);
    if (pcVar2 == (char *)0x0) goto LAB_0010193f;
  } while (CONCAT31(uStack_a4,local_a8._3_1_) != 0x3a657a69 || local_a8 != 0x69536d56);
  iVar1 = impl::ParseLine((char *)&local_a8);
  iVar3 = (long)iVar1 << 10;
LAB_0010193f:
  fclose(__stream);
  return iVar3;
}

Assistant:

int64_t npas4::GetRAMVirtualUsedByCurrentProcess()
{
#ifdef WIN32
	PROCESS_MEMORY_COUNTERS_EX pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), reinterpret_cast<PPROCESS_MEMORY_COUNTERS>(&pmc), sizeof(pmc));
	return pmc.PrivateUsage;
#else
	// Verified Correct.
	constexpr int BufferSize{128};
	int64_t result = 0;
	FILE* file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != NULL)
	{
		if(strncmp(line, "VmSize:", 7) == 0)
		{
			result = npas4::impl::ParseLine(line) * Kilobytes2Bytes;
			break;
		}
	}

	fclose(file);
	return result;
#endif
}